

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::ULMASS(sophia_interface *this,int KF)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar8 = -KF;
  if (0 < KF) {
    uVar8 = KF;
  }
  iVar3 = LUCOMP(this,KF);
  if (iVar3 == 0) {
    return 0.0;
  }
  PARF[0x69] = PMAS[0][5];
  PARF[0x6a] = PMAS[0][6];
  PARF[0x6b] = PMAS[0][7];
  lVar9 = (long)iVar3;
  if (uVar8 < 0xb && MSTJ[0x5c] - 1U < 2) {
    dVar14 = PARF[(ulong)uVar8 + 99];
    if ((MSTJ[0x5c] == 2) && (dVar14 = dVar14 - PARF[0x78], dVar14 <= 0.0)) {
      dVar14 = 0.0;
    }
  }
  else if (uVar8 < 0x65 || iVar3 - 0x65U < 0xffffffec) {
    dVar14 = *(double *)(KCHG[2] + lVar9 * 2 + 0x1f2);
  }
  else {
    uVar6 = (uint)(((ulong)uVar8 / 1000) % 10);
    this = (sophia_interface *)(((ulong)uVar8 / 100) % 10);
    uVar5 = uVar8 % 10;
    uVar1 = (uint)this;
    dVar12 = *(double *)((long)PARF + (ulong)(uVar1 * 8) + 0x318);
    uVar2 = (uint)(((ulong)uVar8 / 10) % 10);
    dVar14 = *(double *)((long)PARF + (ulong)(uVar2 * 8) + 0x318);
    iVar3 = (int)(((ulong)uVar8 / 10000) % 10);
    if (uVar5 < 4 && (uVar6 == 0 && iVar3 == 0)) {
      if (uVar5 == 1) {
        dVar11 = -3.0 / (dVar12 * dVar14);
      }
      else {
        dVar11 = 0.0;
      }
      dVar13 = PARF[0x70];
      dVar10 = PARF[0x6e];
      if (2 < uVar5) {
        dVar11 = 1.0 / (dVar12 * dVar14);
      }
    }
    else {
      if (uVar6 == 0) {
        uVar7 = 0x74;
        if (iVar3 != 2) {
          uVar7 = (ulong)(uVar5 == 1 | 0x72);
        }
        uVar4 = 0x75;
        if (uVar5 != 5) {
          uVar4 = uVar7;
        }
        dVar14 = dVar14 + dVar12 + PARF[uVar4];
        goto LAB_00126db9;
      }
      dVar10 = *(double *)((long)PARF + (ulong)(uVar6 * 8) + 0x318);
      if (uVar2 == 0) {
        if (uVar5 == 1) {
          dVar14 = -3.0 / (dVar10 * dVar12);
        }
        else {
          dVar14 = 0.0;
        }
        if (uVar5 == 3) {
          dVar14 = 1.0 / (dVar10 * dVar12);
        }
        dVar11 = (PARF[0x6f] + PARF[0x6f]) / 3.0;
        dVar13 = PARF[0x71] * PARF[100] * PARF[100] * dVar14 + dVar10 + dVar11 + dVar12;
        dVar14 = dVar13;
        if (MSTJ[0x5c] == 1) {
          dVar14 = dVar10 + dVar12;
        }
        if ((MSTJ[0x5c] == 2) && (dVar14 = (dVar13 - PARF[0x79]) - dVar11, dVar14 <= 0.0)) {
          dVar14 = 0.0;
        }
        goto LAB_00126db9;
      }
      if (uVar6 == uVar1 && uVar5 == 2) {
        dVar11 = (1.0 / (dVar10 * dVar12) - 2.0 / (dVar10 * dVar14)) - 2.0 / (dVar12 * dVar14);
      }
      else if (uVar1 < uVar2 || uVar5 != 2) {
        if (uVar5 == 2) {
          dVar11 = -3.0 / (dVar12 * dVar14);
        }
        else {
          dVar11 = 1.0 / (dVar12 * dVar14) + 1.0 / (dVar10 * dVar14) + 1.0 / (dVar10 * dVar12);
        }
      }
      else {
        dVar11 = 1.0 / (dVar12 * dVar14) + -2.0 / (dVar10 * dVar14) + -2.0 / (dVar10 * dVar12);
      }
      dVar13 = PARF[0x71];
      dVar10 = dVar10 + PARF[0x6f];
    }
    dVar14 = dVar13 * PARF[100] * PARF[100] * dVar11 + dVar14 + dVar12 + dVar10;
  }
LAB_00126db9:
  if ((0 < MSTJ[0x17]) && (dVar12 = PMAS[0][lVar9 + 499], 0.0001 < dVar12)) {
    if ((MSTJ[0x17] == 1) || (100 < uVar8 && MSTJ[0x17] == 2)) {
      dVar10 = RLU(this,false);
      dVar11 = atan((PMAS[1][lVar9 + 499] + PMAS[1][lVar9 + 499]) / PMAS[0][lVar9 + 499]);
      dVar10 = tan(dVar11 * (dVar10 + dVar10 + -1.0));
      dVar14 = dVar14 + dVar10 * dVar12 * 0.5;
    }
    else {
      dVar10 = dVar14 - PMAS[1][lVar9 + 499];
      if (dVar10 <= 0.0) {
        dVar10 = 0.0;
      }
      dVar10 = atan((dVar10 * dVar10 + -dVar14 * dVar14) / (dVar12 * dVar14));
      dVar12 = PMAS[1][lVar9 + 499] + dVar14;
      dVar11 = atan((dVar12 * dVar12 + -dVar14 * dVar14) / (PMAS[0][lVar9 + 499] * dVar14));
      dVar12 = PMAS[0][lVar9 + 499];
      dVar13 = RLU(this,false);
      dVar10 = tan(dVar13 * (dVar11 - dVar10) + dVar10);
      dVar14 = dVar14 * dVar14 + dVar10 * dVar12 * dVar14;
      if (dVar14 <= 0.0) {
        dVar14 = 0.0;
      }
      dVar14 = SQRT(dVar14);
    }
  }
  MSTJ[0x5c] = 0;
  return dVar14;
}

Assistant:

double sophia_interface::ULMASS(int KF) {
// Purpose: to give the mass of a particle/parton.
    double result = 0.;
    int KFA = std::abs(KF);
    int KC = LUCOMP(KF);
    if (KC == 0) return 0;
    PARF[105] = PMAS[0][5];
    PARF[106] = PMAS[0][6];
    PARF[107] = PMAS[0][7];

    // Guarantee use of constituent masses for internal checks.
    if ((MSTJ[92] == 1 || MSTJ[92] == 2) && KFA <= 10) {
        result = PARF[99 + KFA];
        if (MSTJ[92] == 2) result = std::max(0., result - PARF[120]);

    // Masses that can be read directly off table.
    } else if (KFA <= 100 || KC <= 80 || KC > 100) {
        result = PMAS[0][KC - 1];

    // Find constituent partons and their masses.
    } else {
        int KFLA = (KFA / 1000) % 10;
        int KFLB = (KFA / 100) % 10;
        int KFLC = (KFA / 10) % 10;
        int KFLS = KFA % 10;
        int KFLR = (KFA / 10000) % 10;
        double PMA = PARF[99 + KFLA];
        double PMB = PARF[99 + KFLB];
        double PMC = PARF[99 + KFLC];
        double PMSPL = 0.;

        // Construct masses for various meson, diquark and baryon cases.
        if (KFLA == 0 && KFLR == 0 && KFLS <= 3) {
            if (KFLS == 1) PMSPL = -3. / (PMB * PMC);
            if (KFLS >= 3) PMSPL = 1. / (PMB * PMC);
            result = PARF[110] + PMB + PMC + PARF[112] * PARF[100] * PARF[100] * PMSPL;
        } else if (KFLA == 0) {
            int KMUL = 2;
            if (KFLS == 1) KMUL = 3;
            if (KFLR == 2) KMUL = 4;
            if (KFLS == 5) KMUL = 5;
            result = PARF[112 + KMUL] + PMB + PMC;
        } else if (KFLC == 0) {
            if (KFLS == 1) PMSPL = -3. / (PMA * PMB);
            if (KFLS == 3) PMSPL = 1. / (PMA * PMB);
            result = 2. * PARF[111] / 3. + PMA + PMB + PARF[113] * PARF[100] * PARF[100] * PMSPL; 
            if (MSTJ[92] == 1) result = PMA + PMB;
            if (MSTJ[92] == 2) result = std::max(0., result - PARF[121] - 2. * PARF[111] / 3.);
      } else {
            if (KFLS == 2 && KFLA == KFLB) {
                PMSPL = 1. / (PMA * PMB) - 2. / (PMA * PMC) - 2. / (PMB * PMC);
            } else if (KFLS == 2 && KFLB >= KFLC) {
                PMSPL = -2. / (PMA * PMB) - 2. / (PMA * PMC) + 1. / (PMB * PMC);
            } else if (KFLS == 2) {
                PMSPL = -3. / (PMB * PMC);
            } else {
                PMSPL = 1. / (PMA * PMB) + 1. / (PMA * PMC) + 1. / (PMB * PMC);
            }
            result = PARF[111] + PMA + PMB + PMC + PARF[113] * PARF[100] * PARF[100] * PMSPL;
        }
    }

    // Optional mass broadening according to truncated Breit-Wigner (either in m or in m^2).
    if (MSTJ[23] >= 1 && PMAS[1][KC - 1] > 1e-4) {
        if (MSTJ[23] == 1 || (MSTJ[23] == 2 && KFA > 100)) {
            result += 0.5 * PMAS[1][KC - 1] * std::tan((2. * RLU() - 1.) * std::atan(2. * PMAS[2][KC - 1] / PMAS[1][KC - 1]));
        } else {
            double PM0 = result;
            double PMLOW = std::atan((std::pow(std::max(0., PM0 - PMAS[2][KC - 1]), 2) - PM0 * PM0) / (PM0 * PMAS[1][KC - 1]));
            double PMUPP = std::atan((std::pow((PM0 + PMAS[2][KC - 1]), 2) - PM0* PM0) / (PM0 * PMAS[1][KC - 1]));
            result = std::sqrt(std::max(0., PM0 * PM0 + PM0 * PMAS[1][KC - 1] * std::tan(PMLOW + (PMUPP - PMLOW) * RLU())));
        }
    }
    MSTJ[92] = 0;
    return result;
}